

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O0

void __thiscall CInput::MouseModeRelative(CInput *this)

{
  int iVar1;
  CConfig *pCVar2;
  IConsole *pIVar3;
  CInput *in_RDI;
  char *local_18;
  
  if ((in_RDI->m_MouseInputRelative & 1U) == 0) {
    in_RDI->m_MouseInputRelative = true;
    SDL_ShowCursor(0);
    pCVar2 = Config(in_RDI);
    if (pCVar2->m_InpGrab == 0) {
      local_18 = "1";
    }
    else {
      local_18 = "0";
    }
    iVar1 = SDL_SetHintWithPriority("SDL_MOUSE_RELATIVE_MODE_WARP",local_18,2);
    if (iVar1 == 0) {
      pIVar3 = Console(in_RDI);
      (*(pIVar3->super_IInterface)._vptr_IInterface[0x19])
                (pIVar3,0,"input","unable to switch relative mouse mode");
    }
    SDL_SetRelativeMouseMode(1);
    SDL_GetRelativeMouseState(0);
  }
  return;
}

Assistant:

void CInput::MouseModeRelative()
{
	if(!m_MouseInputRelative)
	{
		m_MouseInputRelative = true;
		SDL_ShowCursor(SDL_DISABLE);
		if(SDL_SetHintWithPriority(SDL_HINT_MOUSE_RELATIVE_MODE_WARP, Config()->m_InpGrab ? "0" : "1", SDL_HINT_OVERRIDE) == SDL_FALSE)
		{
			Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "input", "unable to switch relative mouse mode");
		}
		SDL_SetRelativeMouseMode(SDL_TRUE);
		SDL_GetRelativeMouseState(NULL, NULL);
	}
}